

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall vera::Camera::updateProjectionViewMatrix(Camera *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mat<3,_3,_float,_(glm::qualifier)0> *m;
  mat<3,_3,_float,_(glm::qualifier)0> *m_00;
  mat4 local_13c;
  mat4 local_fc;
  mat<3,_3,_float,_(glm::qualifier)0> local_bc;
  mat<3,_3,_float,_(glm::qualifier)0> local_98;
  transpose_type local_74;
  mat<4,_4,_float,_(glm::qualifier)0> local_50;
  Camera *local_10;
  Camera *this_local;
  
  local_10 = this;
  iVar1 = (*(this->super_Node)._vptr_Node[0x56])();
  glm::operator*(&local_50,&this->m_projectionMatrix,
                 (mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var,iVar1));
  memcpy(&this->m_projectionViewMatrix,&local_50,0x40);
  iVar1 = (*(this->super_Node)._vptr_Node[0x56])();
  glm::mat<3,_3,_float,_(glm::qualifier)0>::mat
            (&local_bc,(mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var_00,iVar1));
  glm::inverse<3,3,float,(glm::qualifier)0>(&local_98,(glm *)&local_bc,m);
  glm::transpose<3,3,float,(glm::qualifier)0>(&local_74,(glm *)&local_98,m_00);
  memcpy(&this->m_normalMatrix,&local_74,0x24);
  iVar1 = (*(this->super_Node)._vptr_Node[0x56])();
  inverseMatrix(&local_fc,(mat4 *)CONCAT44(extraout_var_01,iVar1));
  memcpy(&this->m_inverseViewMatrix,&local_fc,0x40);
  inverseMatrix(&local_13c,&this->m_projectionMatrix);
  memcpy(&this->m_inverseProjectionMatrix,&local_13c,0x40);
  (this->super_Node).bChange = true;
  return;
}

Assistant:

void Camera::updateProjectionViewMatrix() {
    m_projectionViewMatrix = m_projectionMatrix * getViewMatrix();
    m_normalMatrix = glm::transpose(glm::inverse(glm::mat3(getViewMatrix())));

    m_inverseViewMatrix = vera::inverseMatrix(getViewMatrix());
    m_inverseProjectionMatrix = vera::inverseMatrix(m_projectionMatrix);
    
    bChange = true;
}